

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorProto::DescriptorProto(DescriptorProto *this,DescriptorProto *from)

{
  void *pvVar1;
  string *initial_value;
  MessageOptions *this_00;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__DescriptorProto_0042baa0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->field_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->field_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->field_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->field_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->field_).super_RepeatedPtrFieldBase,&(from->field_).super_RepeatedPtrFieldBase);
  (this->nested_type_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->nested_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->nested_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->nested_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
            (&(this->nested_type_).super_RepeatedPtrFieldBase,
             &(from->nested_type_).super_RepeatedPtrFieldBase);
  (this->enum_type_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->enum_type_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             &(from->enum_type_).super_RepeatedPtrFieldBase);
  (this->extension_range_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->extension_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_range_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_range_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
            (&(this->extension_range_).super_RepeatedPtrFieldBase,
             &(from->extension_range_).super_RepeatedPtrFieldBase);
  (this->extension_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->extension_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->extension_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
            (&(this->extension_).super_RepeatedPtrFieldBase,
             &(from->extension_).super_RepeatedPtrFieldBase);
  (this->oneof_decl_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->oneof_decl_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
            (&(this->oneof_decl_).super_RepeatedPtrFieldBase,
             &(from->oneof_decl_).super_RepeatedPtrFieldBase);
  (this->reserved_range_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->reserved_range_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
            (&(this->reserved_range_).super_RepeatedPtrFieldBase,
             &(from->reserved_range_).super_RepeatedPtrFieldBase);
  (this->reserved_name_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->reserved_name_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
            (&(this->reserved_name_).super_RepeatedPtrFieldBase,
             &(from->reserved_name_).super_RepeatedPtrFieldBase);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((((from->_has_bits_).has_bits_[0] & 1) != 0) &&
     (initial_value = (from->name_).ptr_,
     initial_value != (string *)&internal::fixed_address_empty_string_abi_cxx11_)) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&this->name_,initial_value);
  }
  if (((from->_has_bits_).has_bits_[0] & 2) == 0) {
    this_00 = (MessageOptions *)0x0;
  }
  else {
    this_00 = (MessageOptions *)operator_new(0x70);
    MessageOptions::MessageOptions(this_00,from->options_);
  }
  this->options_ = this_00;
  return;
}

Assistant:

DescriptorProto::DescriptorProto(const DescriptorProto& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      field_(from.field_),
      nested_type_(from.nested_type_),
      enum_type_(from.enum_type_),
      extension_range_(from.extension_range_),
      extension_(from.extension_),
      oneof_decl_(from.oneof_decl_),
      reserved_range_(from.reserved_range_),
      reserved_name_(from.reserved_name_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  if (from.has_options()) {
    options_ = new ::google::protobuf::MessageOptions(*from.options_);
  } else {
    options_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.DescriptorProto)
}